

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O0

void __thiscall
icu_63::number::impl::DecimalQuantity::roundToMagnitude
          (DecimalQuantity *this,int32_t magnitude,RoundingMode roundingMode,UErrorCode *status)

{
  int8_t iVar1;
  int8_t iVar2;
  bool bVar3;
  UBool UVar4;
  int32_t a;
  int32_t iVar5;
  int local_40;
  int8_t digit0;
  int bubblePos;
  bool roundDown;
  int32_t iStack_34;
  bool roundsAtMidpoint;
  int32_t minP;
  int32_t p_1;
  int p;
  Section section;
  int8_t trailingDigit;
  int8_t leadingDigit;
  int position;
  UErrorCode *status_local;
  RoundingMode roundingMode_local;
  int32_t magnitude_local;
  DecimalQuantity *this_local;
  
  a = anon_unknown.dwarf_7d65c::safeSubtract(magnitude,this->scale);
  if ((a < 1) && (this->isApproximate == '\0')) {
    return;
  }
  if (this->precision == 0) {
    return;
  }
  iVar5 = anon_unknown.dwarf_7d65c::safeSubtract(a,1);
  iVar1 = getDigitPos(this,iVar5);
  iVar2 = getDigitPos(this,a);
  p_1 = 2;
  if (this->isApproximate == '\0') {
    if (iVar1 < '\x05') {
      p_1 = 1;
    }
    else if (iVar1 < '\x06') {
      for (minP = anon_unknown.dwarf_7d65c::safeSubtract(a,2); -1 < minP; minP = minP + -1) {
        iVar1 = getDigitPos(this,minP);
        if (iVar1 != '\0') {
          p_1 = 3;
          break;
        }
      }
    }
    else {
      p_1 = 3;
    }
  }
  else {
    iStack_34 = anon_unknown.dwarf_7d65c::safeSubtract(a,2);
    iVar5 = uprv_max_63(0,this->precision + -0xe);
    if (iVar1 == '\0') {
      p_1 = -1;
      for (; iVar5 <= iStack_34; iStack_34 = iStack_34 + -1) {
        iVar1 = getDigitPos(this,iStack_34);
        if (iVar1 != '\0') {
          p_1 = 1;
          break;
        }
      }
    }
    else if (iVar1 == '\x04') {
      for (; iVar5 <= iStack_34; iStack_34 = iStack_34 + -1) {
        iVar1 = getDigitPos(this,iStack_34);
        if (iVar1 != '\t') {
          p_1 = 1;
          break;
        }
      }
    }
    else if (iVar1 == '\x05') {
      for (; iVar5 <= iStack_34; iStack_34 = iStack_34 + -1) {
        iVar1 = getDigitPos(this,iStack_34);
        if (iVar1 != '\0') {
          p_1 = 3;
          break;
        }
      }
    }
    else if (iVar1 == '\t') {
      p_1 = -2;
      for (; iVar5 <= iStack_34; iStack_34 = iStack_34 + -1) {
        iVar1 = getDigitPos(this,iStack_34);
        if (iVar1 != '\t') {
          p_1 = 3;
          break;
        }
      }
    }
    else if (iVar1 < '\x05') {
      p_1 = 1;
    }
    else {
      p_1 = 3;
    }
    bVar3 = roundingutils::roundsAtMidpoint(roundingMode);
    iVar5 = anon_unknown.dwarf_7d65c::safeSubtract(a,1);
    if (((iVar5 < this->precision + -0xe) || ((bVar3 && (p_1 == 2)))) || ((!bVar3 && (p_1 < 0)))) {
      convertToAccurateDouble(this);
      roundToMagnitude(this,magnitude,roundingMode,status);
      return;
    }
    this->isApproximate = '\0';
    this->origDouble = 0.0;
    this->origDelta = 0;
    if (a < 1) {
      return;
    }
    if (p_1 == -1) {
      p_1 = 1;
    }
    if (p_1 == -2) {
      p_1 = 3;
    }
  }
  bVar3 = isNegative(this);
  bVar3 = roundingutils::getRoundingDirection((int)iVar2 % 2 == 0,bVar3,p_1,roundingMode,status);
  UVar4 = ::U_FAILURE(*status);
  if (UVar4 == '\0') {
    if (a < this->precision) {
      shiftRight(this,a);
    }
    else {
      setBcdToZero(this);
      this->scale = magnitude;
    }
    if (!bVar3) {
      if (iVar2 == '\t') {
        local_40 = 0;
        while (iVar1 = getDigitPos(this,local_40), iVar1 == '\t') {
          local_40 = local_40 + 1;
        }
        shiftRight(this,local_40);
      }
      iVar1 = getDigitPos(this,0);
      setDigitPos(this,0,iVar1 + '\x01');
      this->precision = this->precision + 1;
    }
    compact(this);
  }
  return;
}

Assistant:

void DecimalQuantity::roundToMagnitude(int32_t magnitude, RoundingMode roundingMode, UErrorCode& status) {
    // The position in the BCD at which rounding will be performed; digits to the right of position
    // will be rounded away.
    // TODO: Andy: There was a test failure because of integer overflow here. Should I do
    // "safe subtraction" everywhere in the code?  What's the nicest way to do it?
    int position = safeSubtract(magnitude, scale);

    if (position <= 0 && !isApproximate) {
        // All digits are to the left of the rounding magnitude.
    } else if (precision == 0) {
        // No rounding for zero.
    } else {
        // Perform rounding logic.
        // "leading" = most significant digit to the right of rounding
        // "trailing" = least significant digit to the left of rounding
        int8_t leadingDigit = getDigitPos(safeSubtract(position, 1));
        int8_t trailingDigit = getDigitPos(position);

        // Compute which section of the number we are in.
        // EDGE means we are at the bottom or top edge, like 1.000 or 1.999 (used by doubles)
        // LOWER means we are between the bottom edge and the midpoint, like 1.391
        // MIDPOINT means we are exactly in the middle, like 1.500
        // UPPER means we are between the midpoint and the top edge, like 1.916
        roundingutils::Section section = roundingutils::SECTION_MIDPOINT;
        if (!isApproximate) {
            if (leadingDigit < 5) {
                section = roundingutils::SECTION_LOWER;
            } else if (leadingDigit > 5) {
                section = roundingutils::SECTION_UPPER;
            } else {
                for (int p = safeSubtract(position, 2); p >= 0; p--) {
                    if (getDigitPos(p) != 0) {
                        section = roundingutils::SECTION_UPPER;
                        break;
                    }
                }
            }
        } else {
            int32_t p = safeSubtract(position, 2);
            int32_t minP = uprv_max(0, precision - 14);
            if (leadingDigit == 0) {
                section = roundingutils::SECTION_LOWER_EDGE;
                for (; p >= minP; p--) {
                    if (getDigitPos(p) != 0) {
                        section = roundingutils::SECTION_LOWER;
                        break;
                    }
                }
            } else if (leadingDigit == 4) {
                for (; p >= minP; p--) {
                    if (getDigitPos(p) != 9) {
                        section = roundingutils::SECTION_LOWER;
                        break;
                    }
                }
            } else if (leadingDigit == 5) {
                for (; p >= minP; p--) {
                    if (getDigitPos(p) != 0) {
                        section = roundingutils::SECTION_UPPER;
                        break;
                    }
                }
            } else if (leadingDigit == 9) {
                section = roundingutils::SECTION_UPPER_EDGE;
                for (; p >= minP; p--) {
                    if (getDigitPos(p) != 9) {
                        section = roundingutils::SECTION_UPPER;
                        break;
                    }
                }
            } else if (leadingDigit < 5) {
                section = roundingutils::SECTION_LOWER;
            } else {
                section = roundingutils::SECTION_UPPER;
            }

            bool roundsAtMidpoint = roundingutils::roundsAtMidpoint(roundingMode);
            if (safeSubtract(position, 1) < precision - 14 ||
                (roundsAtMidpoint && section == roundingutils::SECTION_MIDPOINT) ||
                (!roundsAtMidpoint && section < 0 /* i.e. at upper or lower edge */)) {
                // Oops! This means that we have to get the exact representation of the double, because
                // the zone of uncertainty is along the rounding boundary.
                convertToAccurateDouble();
                roundToMagnitude(magnitude, roundingMode, status); // start over
                return;
            }

            // Turn off the approximate double flag, since the value is now confirmed to be exact.
            isApproximate = false;
            origDouble = 0.0;
            origDelta = 0;

            if (position <= 0) {
                // All digits are to the left of the rounding magnitude.
                return;
            }

            // Good to continue rounding.
            if (section == -1) { section = roundingutils::SECTION_LOWER; }
            if (section == -2) { section = roundingutils::SECTION_UPPER; }
        }

        bool roundDown = roundingutils::getRoundingDirection((trailingDigit % 2) == 0,
                isNegative(),
                section,
                roundingMode,
                status);
        if (U_FAILURE(status)) {
            return;
        }

        // Perform truncation
        if (position >= precision) {
            setBcdToZero();
            scale = magnitude;
        } else {
            shiftRight(position);
        }

        // Bubble the result to the higher digits
        if (!roundDown) {
            if (trailingDigit == 9) {
                int bubblePos = 0;
                // Note: in the long implementation, the most digits BCD can have at this point is 15,
                // so bubblePos <= 15 and getDigitPos(bubblePos) is safe.
                for (; getDigitPos(bubblePos) == 9; bubblePos++) {}
                shiftRight(bubblePos); // shift off the trailing 9s
            }
            int8_t digit0 = getDigitPos(0);
            U_ASSERT(digit0 != 9);
            setDigitPos(0, static_cast<int8_t>(digit0 + 1));
            precision += 1; // in case an extra digit got added
        }

        compact();
    }
}